

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

block * gen_geneve_ll_check(compiler_state_t *cstate)

{
  slist *s0;
  slist *s1_00;
  block *b;
  slist *s1;
  slist *s;
  block *b0;
  compiler_state_t *cstate_local;
  
  s0 = new_stmt(cstate,0x60);
  (s0->s).k = (cstate->off_linkhdr).reg;
  s1_00 = new_stmt(cstate,0x61);
  (s1_00->s).k = (cstate->off_linkpl).reg;
  sappend(s0,s1_00);
  b = new_block(cstate,0x1d);
  b->stmts = s0;
  (b->s).k = 0;
  gen_not(b);
  return b;
}

Assistant:

static struct block *
gen_geneve_ll_check(compiler_state_t *cstate)
{
	struct block *b0;
	struct slist *s, *s1;

	/* The easiest way to see if there is a link layer present
	 * is to check if the link layer header and payload are not
	 * the same. */

	/* Geneve always generates pure variable offsets so we can
	 * compare only the registers. */
	s = new_stmt(cstate, BPF_LD|BPF_MEM);
	s->s.k = cstate->off_linkhdr.reg;

	s1 = new_stmt(cstate, BPF_LDX|BPF_MEM);
	s1->s.k = cstate->off_linkpl.reg;
	sappend(s, s1);

	b0 = new_block(cstate, BPF_JMP|BPF_JEQ|BPF_X);
	b0->stmts = s;
	b0->s.k = 0;
	gen_not(b0);

	return b0;
}